

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eia608.c
# Opt level: O0

eia608_control_t eia608_parse_control(uint16_t cc_data,int *cc)

{
  uint uVar1;
  int *cc_local;
  uint16_t cc_data_local;
  eia608_control_t local_4;
  
  if ((cc_data & 0x200) == 0) {
    uVar1 = 0;
    if ((cc_data & 0x100) != 0) {
      uVar1 = 2;
    }
    *cc = (cc_data & 0x800) != 0 | uVar1;
    local_4 = cc_data & 0x167f;
  }
  else {
    *cc = (uint)((cc_data & 0x800) != 0);
    local_4 = cc_data & 0x177f;
  }
  return local_4;
}

Assistant:

eia608_control_t eia608_parse_control(uint16_t cc_data, int* cc)
{
    if (0x0200 & cc_data) {
        (*cc) = (cc_data & 0x0800 ? 0x01 : 0x00);
        return (eia608_control_t)(0x177F & cc_data);
    } else {
        (*cc) = (cc_data & 0x0800 ? 0x01 : 0x00) | (cc_data & 0x0100 ? 0x02 : 0x00);
        return (eia608_control_t)(0x167F & cc_data);
    }
}